

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall
CTcSymMetaclassBase::add_prop
          (CTcSymMetaclassBase *this,char *txt,size_t len,char *obj_fname,int is_static)

{
  byte *pbVar1;
  short sVar2;
  int iVar3;
  undefined4 extraout_var;
  CVmHashEntry *this_00;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar4;
  
  pCVar4 = G_prs->global_symtab_;
  do {
    iVar3 = (*pCVar4->_vptr_CTcPrsSymtab[2])(pCVar4,txt,len);
    this_00 = (CVmHashEntry *)CONCAT44(extraout_var,iVar3);
    if (this_00 != (CVmHashEntry *)0x0) {
      (*this_00->_vptr_CVmHashEntry[0xf])(this_00);
      if (*(int *)&this_00->field_0x24 != 3) {
        if (obj_fname != (char *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e1c,len & 0xffffffff,
                             txt,"property",obj_fname);
          return;
        }
        CTcTokenizer::log_error_curtok(G_tok,0x2b63);
        return;
      }
      goto LAB_002319a3;
    }
    pCVar4 = pCVar4->parent_;
  } while (pCVar4 != (CTcPrsSymtab *)0x0);
  this_00 = (CVmHashEntry *)CTcPrsMem::alloc(G_prsmem,0x30);
  sVar2 = (short)*(undefined4 *)&G_cg->next_prop_;
  G_cg->next_prop_ = sVar2 + 1;
  CVmHashEntry::CVmHashEntry(this_00,txt,len,0);
  *(undefined4 *)&this_00->field_0x24 = 3;
  *(short *)&this_00[1]._vptr_CVmHashEntry = sVar2;
  pbVar1 = (byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2);
  *pbVar1 = *pbVar1 & 0xf8;
  this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0035b960;
  (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this_00);
LAB_002319a3:
  (*this_00->_vptr_CVmHashEntry[0xf])(this_00);
  add_prop(this,(CTcSymProp *)this_00,is_static);
  return;
}

Assistant:

void CTcSymMetaclassBase::add_prop(
    const char *txt, size_t len, const char *obj_fname, int is_static)
{
    /* see if this property is already defined */
    CTcSymProp *prop_sym =
        (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (prop_sym != 0)
    {
        /* it's already defined - make sure it's a property */
        if (prop_sym->get_type() != TC_SYM_PROP)
        {
            /* 
             *   it's something other than a property - log the
             *   appropriate type of error, depending on whether we're
             *   loading this from an object file or from source code 
             */
            if (obj_fname == 0)
            {
                /* creating from source - note the code location */
                G_tok->log_error_curtok(TCERR_REDEF_AS_PROP);
            }
            else
            {
                /* loading from an object file */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_REDEF_SYM_TYPE,
                                    (int)len, txt, "property", obj_fname);
            }

            /* forget the symbol - it's not a property */
            prop_sym = 0;
        }
    }
    else
    {
        /* add the property definition */
        prop_sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(prop_sym);
    }

    /* 
     *   if we found a valid property symbol, add it to the metaclass
     *   property list 
     */
    if (prop_sym != 0)
    {
        /* 
         *   mark the symbol as referenced - even if we don't directly
         *   make use of it, the metaclass table references this symbol 
         */
        prop_sym->mark_referenced();
        
        /* add the property to the metaclass list */
        add_prop(prop_sym, is_static);
    }
}